

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

bool SetHasKeys<std::__cxx11::string,char[11],char[10],char[10],char[10],char[13]>
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *set,char (*key) [11],char (*args) [10],char (*args_1) [10],char (*args_2) [10],
               char (*args_3) [13])

{
  size_type sVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  char (*in_R9) [10];
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  key_type *in_stack_ffffffffffffff60;
  undefined5 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6d;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  byte bVar2;
  char (*in_stack_ffffffffffffff90) [13];
  allocator<char> *in_stack_ffffffffffffff98;
  allocator<char> local_29 [33];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_R8,*in_R9,in_stack_ffffffffffffff98);
  sVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffff6f,
                              CONCAT16(in_stack_ffffffffffffff6e,
                                       CONCAT15(in_stack_ffffffffffffff6d,in_stack_ffffffffffffff68)
                                      )),in_stack_ffffffffffffff60);
  bVar2 = true;
  if (sVar1 == 0) {
    bVar2 = SetHasKeys<std::__cxx11::string,char[10],char[10],char[10],char[13]>
                      (in_RCX,(char (*) [10])in_R8,in_R9,(char (*) [10])in_stack_ffffffffffffff98,
                       in_stack_ffffffffffffff90);
  }
  std::__cxx11::string::~string(in_stack_ffffffffffffff58);
  std::allocator<char>::~allocator(local_29);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static inline bool SetHasKeys(const std::set<T>& set, const Tk& key, const Args&... args)
{
    return (set.count(key) != 0) || SetHasKeys(set, args...);
}